

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.cpp
# Opt level: O2

RealType __thiscall
OpenMD::GB::getSuggestedCutoffRadius(GB *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  bool bVar1;
  RealType RVar2;
  RealType RVar3;
  double dVar4;
  double dVar5;
  GayBerneAdapter gba2;
  LennardJonesAdapter lja2;
  LennardJonesAdapter lja1;
  GayBerneAdapter gba1;
  GayBerneAdapter local_38;
  LennardJonesAdapter local_30;
  LennardJonesAdapter local_28;
  double local_20;
  GayBerneAdapter local_18;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  local_38.at_ = atypes.second;
  local_30.at_ = atypes.second;
  local_28.at_ = atypes.first;
  local_18.at_ = atypes.first;
  bVar1 = GayBerneAdapter::isGayBerne(&local_18);
  if (bVar1) {
    RVar2 = GayBerneAdapter::getD(&local_18);
    RVar3 = GayBerneAdapter::getL(&local_18);
    if (RVar3 <= RVar2) {
      RVar3 = RVar2;
    }
    dVar4 = RVar3 * 3.5355339059327378;
  }
  else {
    bVar1 = LennardJonesAdapter::isLennardJones(&local_28);
    dVar4 = 0.0;
    if (!bVar1) goto LAB_0022235d;
    RVar3 = LennardJonesAdapter::getSigma(&local_28);
    dVar4 = RVar3 * 2.5;
  }
  if (dVar4 <= 0.0) {
    dVar4 = 0.0;
  }
LAB_0022235d:
  bVar1 = GayBerneAdapter::isGayBerne(&local_38);
  if (bVar1) {
    local_20 = GayBerneAdapter::getD(&local_38);
    RVar3 = GayBerneAdapter::getL(&local_38);
    if (RVar3 <= local_20) {
      RVar3 = local_20;
    }
    dVar5 = RVar3 * 3.5355339059327378;
  }
  else {
    bVar1 = LennardJonesAdapter::isLennardJones(&local_30);
    if (!bVar1) {
      return dVar4;
    }
    RVar3 = LennardJonesAdapter::getSigma(&local_30);
    dVar5 = RVar3 * 2.5;
  }
  if (dVar5 <= dVar4) {
    dVar5 = dVar4;
  }
  return dVar5;
}

Assistant:

RealType GB::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    RealType cut = 0.0;

    LennardJonesAdapter lja1 = LennardJonesAdapter(atypes.first);
    GayBerneAdapter gba1     = GayBerneAdapter(atypes.first);
    LennardJonesAdapter lja2 = LennardJonesAdapter(atypes.second);
    GayBerneAdapter gba2     = GayBerneAdapter(atypes.second);

    if (gba1.isGayBerne()) {
      RealType d1 = gba1.getD();
      RealType l1 = gba1.getL();
      // sigma is actually sqrt(2)*l  for prolate ellipsoids
      cut = max(cut, RealType(2.5) * sqrt(RealType(2.0)) * max(d1, l1));
    } else if (lja1.isLennardJones()) {
      cut = max(cut, RealType(2.5) * lja1.getSigma());
    }

    if (gba2.isGayBerne()) {
      RealType d2 = gba2.getD();
      RealType l2 = gba2.getL();
      cut         = max(cut, RealType(2.5) * sqrt(RealType(2.0)) * max(d2, l2));
    } else if (lja2.isLennardJones()) {
      cut = max(cut, RealType(2.5) * lja2.getSigma());
    }

    return cut;
  }